

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O1

Vec_Int_t * Ree_ManDeriveAdds(Hash_IntMan_t *p,Vec_Int_t *vData,int fVerbose)

{
  int iVar1;
  int Entry;
  int iVar2;
  int Entry_00;
  int *piVar3;
  void *pvVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  void *pvVar6;
  void *pvVar7;
  uint *__ptr;
  void *__s;
  Vec_Int_t *p_01;
  int *piVar8;
  int *piVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  Vec_Int_t *p_02;
  long lVar20;
  int *local_78;
  long local_68;
  
  iVar12 = p->vObjs->nSize;
  iVar15 = iVar12 + 3;
  if (-1 < iVar12) {
    iVar15 = iVar12;
  }
  uVar17 = iVar15 >> 2;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  uVar11 = 0x10;
  if (0xe < uVar17 - 1) {
    uVar11 = uVar17;
  }
  lVar16 = (long)(int)uVar11;
  if (uVar11 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = malloc(lVar16 * 4);
  }
  lVar18 = (long)(int)uVar17;
  if (pvVar6 != (void *)0x0) {
    memset(pvVar6,0,lVar18 * 4);
  }
  if (uVar11 == 0) {
    pvVar7 = (void *)0x0;
  }
  else {
    pvVar7 = malloc(lVar16 * 4);
  }
  if (pvVar7 != (void *)0x0) {
    memset(pvVar7,0,lVar18 * 4);
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[1] = 0;
  *__ptr = uVar11;
  if (uVar11 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc(lVar16 << 2);
  }
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = uVar17;
  if (__s != (void *)0x0) {
    memset(__s,0xff,lVar18 << 2);
  }
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_01->pArray = piVar5;
  iVar15 = vData->nSize;
  if (2 < iVar15) {
    piVar5 = vData->pArray;
    lVar16 = 2;
    do {
      uVar11 = piVar5[lVar16 + -1];
      if ((int)uVar17 <= (int)uVar11) {
        __assert_fail("Value <= nEntries",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                      ,0x154,"Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
      }
      uVar14 = piVar5[lVar16] - 0x66;
      pvVar4 = pvVar7;
      if ((uVar14 < 0x34) && ((0x9000000000009U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
        pvVar4 = pvVar6;
      }
      if (((int)uVar11 < 0) || ((int)uVar17 <= (int)uVar11)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      piVar8 = (int *)((long)pvVar4 + (ulong)uVar11 * 4);
      *piVar8 = *piVar8 + 1;
      lVar16 = lVar16 + 3;
    } while ((int)lVar16 < iVar15);
  }
  iVar15 = 0;
  if (3 < iVar12) {
    uVar19 = 0;
    iVar15 = 0;
    do {
      if ((*(int *)((long)pvVar6 + uVar19 * 4) != 0) && (*(int *)((long)pvVar7 + uVar19 * 4) != 0))
      {
        Vec_IntPush(p_01,(int)uVar19);
        *(int *)((long)__s + uVar19 * 4) = iVar15;
        iVar15 = iVar15 + 1;
      }
      uVar19 = uVar19 + 1;
    } while (uVar17 != uVar19);
  }
  if (pvVar6 != (void *)0x0) {
    free(pvVar6);
  }
  if (pvVar7 != (void *)0x0) {
    free(pvVar7);
  }
  piVar5 = (int *)malloc(0x10);
  iVar12 = 8;
  if (6 < iVar15 - 1U) {
    iVar12 = iVar15;
  }
  piVar5[1] = 0;
  *piVar5 = iVar12;
  if (iVar12 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)iVar12,0x10);
  }
  *(void **)(piVar5 + 2) = pvVar6;
  piVar5[1] = iVar15;
  piVar8 = (int *)malloc(0x10);
  piVar8[1] = 0;
  *piVar8 = iVar12;
  if (iVar12 == 0) {
    pvVar6 = (void *)0x0;
  }
  else {
    pvVar6 = calloc((long)iVar12,0x10);
  }
  *(void **)(piVar8 + 2) = pvVar6;
  piVar8[1] = iVar15;
  if (2 < vData->nSize) {
    lVar16 = 2;
    do {
      piVar3 = vData->pArray;
      iVar12 = piVar3[lVar16 + -1];
      if (((long)iVar12 < 0) || ((int)uVar17 <= iVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar11 = *(uint *)((long)__s + (long)iVar12 * 4);
      if ((ulong)uVar11 != 0xffffffff) {
        iVar12 = piVar3[lVar16];
        uVar14 = iVar12 - 0x66;
        if ((uVar14 < 0x34) && ((0x9000000000009U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) {
          if (((int)uVar11 < 0) || (piVar5[1] <= (int)uVar11)) goto LAB_00666148;
          pvVar7 = *(void **)(piVar5 + 2);
        }
        else if (((int)uVar11 < 0) || (pvVar7 = pvVar6, iVar15 <= (int)uVar11)) goto LAB_00666148;
        p_02 = (Vec_Int_t *)((ulong)uVar11 * 0x10 + (long)pvVar7);
        Vec_IntPush(p_02,piVar3[lVar16 + -2]);
        Vec_IntPush(p_02,iVar12);
      }
      lVar16 = lVar16 + 3;
    } while ((int)lVar16 < vData->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  iVar12 = p_01->nSize;
  if (0 < (long)iVar12) {
    piVar3 = p_01->pArray;
    uVar10 = 0;
    uVar19 = (ulong)(uint)piVar5[1];
    if (piVar5[1] < 1) {
      uVar19 = uVar10;
    }
    do {
      if ((uVar10 == uVar19) || ((long)piVar8[1] <= (long)uVar10)) {
LAB_00666148:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      iVar15 = piVar3[uVar10];
      lVar18 = *(long *)(piVar5 + 2) + uVar10 * 0x10;
      lVar16 = uVar10 * 0x10 + *(long *)(piVar8 + 2);
      if (iVar15 == 0) {
        local_78 = (int *)0x0;
      }
      else {
        if (iVar15 < 0) {
LAB_00666167:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        if (p->vObjs->nSize <= iVar15 * 4) goto LAB_00666167;
        local_78 = p->vObjs->pArray + (uint)(iVar15 * 4);
      }
      if (1 < *(int *)(lVar18 + 4)) {
        local_68 = 0;
        do {
          if (1 < *(int *)(lVar16 + 4)) {
            iVar15 = *(int *)(*(long *)(lVar18 + 8) + local_68 * 4);
            iVar1 = *(int *)(*(long *)(lVar18 + 8) + 4 + local_68 * 4);
            lVar13 = 0;
            do {
              Entry = *(int *)(*(long *)(lVar16 + 8) + lVar13 * 4);
              iVar2 = *(int *)(*(long *)(lVar16 + 8) + 4 + lVar13 * 4);
              piVar9 = &DAT_00a1b590;
              lVar20 = 0;
              do {
                if (iVar2 == *piVar9) goto LAB_00665f44;
                lVar20 = lVar20 + 1;
                piVar9 = piVar9 + 1;
              } while (lVar20 != 8);
              lVar20 = 8;
LAB_00665f44:
              if ((int)lVar20 == 8) {
                piVar9 = &DAT_00a1b570;
                lVar20 = 0;
                do {
                  if (iVar2 == *piVar9) goto LAB_00665f6b;
                  lVar20 = lVar20 + 1;
                  piVar9 = piVar9 + 1;
                } while (lVar20 != 8);
                lVar20 = 8;
              }
LAB_00665f6b:
              if (7 < (uint)lVar20) {
                __assert_fail("n < 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecRe.c"
                              ,0x186,
                              "Vec_Int_t *Ree_ManDeriveAdds(Hash_IntMan_t *, Vec_Int_t *, int)");
              }
              iVar2 = local_78[1];
              Entry_00 = local_78[2];
              Vec_IntPush(p_00,*local_78);
              Vec_IntPush(p_00,iVar2);
              Vec_IntPush(p_00,Entry_00);
              Vec_IntPush(p_00,iVar15);
              Vec_IntPush(p_00,Entry);
              Vec_IntPush(p_00,(uint)lVar20 | (uint)(iVar1 == 0x69 || iVar1 == 0x99) << 3);
              lVar13 = lVar13 + 2;
            } while ((int)((uint)lVar13 | 1) < *(int *)(lVar16 + 4));
          }
          local_68 = local_68 + 2;
        } while ((int)((uint)local_68 | 1) < *(int *)(lVar18 + 4));
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != (long)iVar12);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  iVar12 = *piVar5;
  if (0 < (long)iVar12) {
    lVar16 = *(long *)(piVar5 + 2);
    lVar18 = 0;
    do {
      pvVar6 = *(void **)(lVar16 + 8 + lVar18);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)(lVar16 + 8 + lVar18) = 0;
      }
      lVar18 = lVar18 + 0x10;
    } while ((long)iVar12 * 0x10 != lVar18);
  }
  if (*(void **)(piVar5 + 2) != (void *)0x0) {
    free(*(void **)(piVar5 + 2));
    piVar5[2] = 0;
    piVar5[3] = 0;
  }
  piVar5[0] = 0;
  piVar5[1] = 0;
  free(piVar5);
  iVar12 = *piVar8;
  if (0 < (long)iVar12) {
    lVar16 = *(long *)(piVar8 + 2);
    lVar18 = 0;
    do {
      pvVar6 = *(void **)(lVar16 + 8 + lVar18);
      if (pvVar6 != (void *)0x0) {
        free(pvVar6);
        *(undefined8 *)(lVar16 + 8 + lVar18) = 0;
      }
      lVar18 = lVar18 + 0x10;
    } while ((long)iVar12 * 0x10 != lVar18);
  }
  if (*(void **)(piVar8 + 2) != (void *)0x0) {
    free(*(void **)(piVar8 + 2));
    piVar8[2] = 0;
    piVar8[3] = 0;
  }
  piVar8[0] = 0;
  piVar8[1] = 0;
  free(piVar8);
  return p_00;
}

Assistant:

Vec_Int_t * Ree_ManDeriveAdds( Hash_IntMan_t * p, Vec_Int_t * vData, int fVerbose )
{
    int i, j, k, iObj, iObj2, Value, Truth, Truth2, CountX, CountM, Index = 0;
    int nEntries = Hash_IntManEntryNum(p);
    Vec_Int_t * vAdds = Vec_IntAlloc( 1000 );
    Vec_Int_t * vXors = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vMajs = Vec_IntStart( nEntries + 1 );
    Vec_Int_t * vIndex = Vec_IntStartFull( nEntries + 1 );
    Vec_Int_t * vIndexRev = Vec_IntAlloc( 1000 );
    Vec_Wec_t * vXorMap, * vMajMap;
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        assert( Value <= nEntries );
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntAddToEntry( vXors, Value, 1 );
        else
            Vec_IntAddToEntry( vMajs, Value, 1 );
    }
    // remap these into indexes
    Vec_IntForEachEntryTwo( vXors, vMajs, CountX, CountM, i )
        if ( CountX && CountM )
        {
            Vec_IntPush( vIndexRev, i );
            Vec_IntWriteEntry( vIndex, i, Index++ );
        }
    Vec_IntFree( vXors );
    Vec_IntFree( vMajs );
    //if ( fVerbose )
    //    printf( "Detected %d shared cuts among %d hashed cuts.\n", Index, nEntries );
    // collect nodes
    vXorMap = Vec_WecStart( Index );
    vMajMap = Vec_WecStart( Index );
    Vec_IntForEachEntryTriple( vData, iObj, Value, Truth, i )
    {
        Index = Vec_IntEntry( vIndex, Value );
        if ( Index == -1 )
            continue;
        if ( Truth == 0x66 || Truth == 0x99 || Truth == 0x69 || Truth == 0x96 )
            Vec_IntPushTwo( Vec_WecEntry(vXorMap, Index), iObj, Truth );
        else
            Vec_IntPushTwo( Vec_WecEntry(vMajMap, Index), iObj, Truth );
    }
    Vec_IntFree( vIndex );
    // create pairs
    Vec_IntForEachEntry( vIndexRev, Value, i )
    {
        Vec_Int_t * vXorOne = Vec_WecEntry( vXorMap, i );
        Vec_Int_t * vMajOne = Vec_WecEntry( vMajMap, i );
        Hash_IntObj_t * pObj = Hash_IntObj( p, Value );
        Vec_IntForEachEntryDouble( vXorOne, iObj, Truth, j )
        Vec_IntForEachEntryDouble( vMajOne, iObj2, Truth2, k )
        {
            int SignAnd[8] = {0x88, 0x44, 0x22, 0x11, 0x77, 0xBB, 0xDD, 0xEE};
            int SignMaj[8] = {0xE8, 0xD4, 0xB2, 0x71, 0x8E, 0x4D, 0x2B, 0x17};
            int n, SignXor = (Truth == 0x99 || Truth == 0x69) << 3;
            for ( n = 0; n < 8; n++ )
                if ( Truth2 == SignMaj[n] )
                    break;
            if ( n == 8 ) 
                for ( n = 0; n < 8; n++ )
                    if ( Truth2 == SignAnd[n] )
                        break;
            assert( n < 8 );
            Vec_IntPushThree( vAdds, pObj->iData0, pObj->iData1, pObj->iData2 ); 
            Vec_IntPushThree( vAdds, iObj, iObj2, SignXor | n );
        }
    }
    Vec_IntFree( vIndexRev );
    Vec_WecFree( vXorMap );
    Vec_WecFree( vMajMap );
    return vAdds;
}